

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86_avx::create_pipeline(DeformableConv2D_x86_avx *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Allocator *pAVar4;
  void *pvVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Mat *pMVar10;
  int _h;
  _func_int **pp_Var11;
  Layer *pLVar12;
  _func_int ***ppp_Var13;
  int *piVar14;
  uint _h_00;
  int _elempack;
  ulong uVar15;
  undefined4 *puVar16;
  Allocator *pAVar17;
  _func_int ***ppp_Var18;
  long lVar19;
  int k;
  ulong uVar20;
  undefined4 *puVar21;
  ulong uVar22;
  long lVar23;
  _func_int ***ppp_Var24;
  _func_int *p_Var25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  _func_int ***ppp_Var31;
  ParamDict pd_5;
  ParamDict pd;
  ParamDict local_178;
  Option *local_168;
  Allocator *local_160;
  Mat local_158;
  undefined8 local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  size_t local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  size_t sStack_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  DeformableConv2D_x86_avx *local_c0;
  Allocator *local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  pp_Var11 = this->_vptr_DeformableConv2D_x86_avx;
  p_Var25 = pp_Var11[-3];
  switch(*(undefined4 *)(&this->field_0x104 + (long)p_Var25)) {
  case 1:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 2:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var25));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 3:
    pLVar12 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var25));
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var25) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 4:
    pLVar12 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 5:
    pLVar12 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 6:
    pLVar12 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var25));
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var25) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  default:
    pLVar12 = (Layer *)0x0;
    goto LAB_00545214;
  }
  ParamDict::~ParamDict((ParamDict *)&local_158);
  (*pLVar12->_vptr_Layer[4])(pLVar12,opt);
  pp_Var11 = this->_vptr_DeformableConv2D_x86_avx;
LAB_00545214:
  this->activation = pLVar12;
  p_Var25 = pp_Var11[-3];
  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var25);
  lVar28 = (long)iVar1;
  iVar2 = *(int *)(&this->field_0xd8 + (long)p_Var25);
  _h_00 = iVar2 * iVar1;
  uVar3 = *(uint *)(&this->field_0xd0 + (long)p_Var25);
  local_b8 = (Allocator *)(ulong)uVar3;
  uVar15 = (long)*(int *)(&this->field_0x100 + (long)p_Var25) / (long)(int)_h_00;
  uVar15 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
  uVar22 = (long)uVar15 / (long)(int)uVar3;
  _h = (int)uVar22;
  iVar27 = 1;
  uVar30 = 1;
  pAVar17 = (Allocator *)((long)uVar15 % (long)(int)uVar3 & 0xffffffff);
  if (opt->use_packing_layout == true) {
    uVar30 = (uint)((uVar22 & 3) == 0) * 3 + 1;
    if ((uVar22 & 7) == 0) {
      uVar30 = 8;
    }
    iVar27 = (uint)((uVar3 & 3) == 0) * 3 + 1;
    pAVar17 = local_b8;
    if ((uVar3 & 7) == 0) {
      iVar27 = 8;
    }
  }
  local_168 = opt;
  local_c0 = this;
  if (opt->use_sgemm_convolution == true) {
    pLVar12 = create_layer(0x4a);
    this->gemm = pLVar12;
    ParamDict::ParamDict(&local_178);
    ParamDict::set(&local_178,2,0);
    ParamDict::set(&local_178,3,0);
    ParamDict::set(&local_178,4,1);
    ParamDict::set(&local_178,5,0);
    ParamDict::set(&local_178,6,1);
    ParamDict::set(&local_178,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    ParamDict::set(&local_178,8,0);
    ParamDict::set(&local_178,9,_h * _h_00);
    ParamDict::set(&local_178,10,
                   -(uint)(*(int *)(&this->field_0xfc +
                                   (long)this->_vptr_DeformableConv2D_x86_avx[-3]) == 0) | 1);
    ParamDict::set(&local_178,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_178);
    local_98.cstep = 0;
    local_98.data = (Allocator *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)local_98.data;
    local_98.dims = (int)local_98.refcount;
    local_98.w = local_98.refcount._4_4_;
    local_98._48_8_ = local_98.elemsize;
    local_98.c = local_98.elempack;
    Mat::reshape(&local_158,
                 (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),_h_00,
                 _h,(int)((Mat *)(&this->field_0x150 +
                                 (long)this->_vptr_DeformableConv2D_x86_avx[-3]))[-2].elemsize,
                 (Allocator *)0x0);
    Mat::create(&local_98,_h * _h_00,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),4,
                (Allocator *)0x0);
    opt = local_168;
    pp_Var11 = this->_vptr_DeformableConv2D_x86_avx;
    p_Var25 = pp_Var11[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var25)) {
      local_160 = (Allocator *)local_98.data;
      uVar15 = (ulong)uVar30;
      lVar28 = 0;
      do {
        if ((int)uVar30 <= _h) {
          ppp_Var13 = (_func_int ***)
                      ((long)(_func_int ***)local_158.data +
                      local_158.elemsize * local_158.cstep * lVar28);
          ppp_Var24 = (_func_int ***)
                      ((long)(_func_int ***)local_98.data +
                      (long)local_98.w * local_98.elemsize * lVar28);
          lVar29 = 0;
          do {
            if (0 < (int)_h_00) {
              uVar20 = 0;
              uVar22 = uVar15;
              ppp_Var31 = ppp_Var13;
              ppp_Var18 = ppp_Var13;
              do {
                do {
                  *(undefined4 *)ppp_Var24 = *(undefined4 *)ppp_Var31;
                  ppp_Var24 = (_func_int ***)((long)ppp_Var24 + 4);
                  uVar22 = uVar22 - 1;
                  ppp_Var31 = (_func_int ***)
                              ((long)ppp_Var31 + (long)local_158.w * local_158.elemsize);
                } while (uVar22 != 0);
                uVar20 = uVar20 + 1;
                ppp_Var31 = (_func_int ***)((long)ppp_Var18 + 4);
                uVar22 = uVar15;
                ppp_Var18 = ppp_Var31;
              } while (uVar20 != _h_00);
            }
            lVar29 = lVar29 + uVar15;
            ppp_Var13 = (_func_int ***)
                        ((long)ppp_Var13 + (long)local_158.w * local_158.elemsize * uVar15);
          } while (lVar29 < (long)((long)_h - (ulong)(uVar30 - 1)));
          p_Var25 = pp_Var11[-3];
          this = local_c0;
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 < *(int *)(&this->field_0xd0 + (long)p_Var25));
    }
    piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86_avx[-3]) == 0) {
      piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = (int)local_98.refcount;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize = local_98.elemsize;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      pLVar12 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uStack_104 = 0;
      local_158.elemsize = SUB128(ZEXT812(0),4);
      local_d0 = 0;
      local_110 = 0;
      uStack_108 = 0;
      local_f8 = 0;
      local_f0 = 0;
      uStack_e8 = 0;
      local_d8 = 0;
      piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      p_Var25 = this->_vptr_DeformableConv2D_x86_avx[-3];
      local_100 = local_158.elemsize;
      uStack_e4 = uStack_104;
      sStack_e0 = local_158.elemsize;
      if (&local_110 != (undefined8 *)(&this->field_0x198 + (long)p_Var25)) {
        piVar14 = *(int **)(&this->field_0x1a0 + (long)p_Var25);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        local_110 = *(undefined8 *)(&this->field_0x198 + (long)p_Var25);
        uStack_108 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var25);
        uStack_104 = (undefined4)
                     ((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var25) >> 0x20);
        local_100 = *(size_t *)(&this->field_0x1a8 + (long)p_Var25);
        local_f8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var25);
        local_f0 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var25);
        sStack_e0 = *(size_t *)(&this->field_0x1c8 + (long)p_Var25);
        uStack_e8 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var25);
        uStack_e4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var25) >> 0x20)
        ;
        local_d8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var25);
        local_d0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var25);
      }
      local_158.cstep = local_98.cstep;
      local_158.c = local_98.c;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.w = local_98.w;
      local_158.dims = local_98.dims;
      local_158.allocator = local_98.allocator;
      local_158.elempack = local_98.elempack;
      local_158.elemsize = local_98.elemsize;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.refcount._0_4_ = (int)local_98.refcount;
      local_158.data = local_98.data;
      pLVar12 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar28 = 0x48;
      do {
        piVar14 = *(int **)((long)&local_158.refcount + lVar28);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar5 = *(void **)((long)&local_158.data + lVar28);
            plVar6 = *(long **)((long)&local_158.allocator + lVar28);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar28) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar28 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar28 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar28) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar28) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar28) = 0;
        *(undefined8 *)((long)&local_158.h + lVar28) = 0;
        *(undefined4 *)((long)&local_158.c + lVar28) = 0;
        lVar28 = lVar28 + -0x48;
      } while (lVar28 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_98.data != (Allocator *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_178);
  }
  else if ((iVar27 == 1) && (uVar30 == 1)) {
    if (p_Var25 != (_func_int *)0xfffffffffffffec0) {
      piVar14 = *(int **)(&this->field_0x158 + (long)p_Var25);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (this->weight_data_tm).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar5 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar5,pAVar17);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar14 = *(int **)((long)(&this->field_0x150 + (long)p_Var25) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x150 + (long)p_Var25);
      (this->weight_data_tm).refcount = piVar14;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x160 + (long)p_Var25);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x168 + (long)p_Var25);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x170 + (long)p_Var25);
      uVar8 = *(undefined8 *)(&this->field_0x178 + (long)p_Var25);
      uVar9 = *(undefined8 *)((long)(&this->field_0x178 + (long)p_Var25) + 8);
      (this->weight_data_tm).dims = (int)uVar8;
      (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).h = (int)uVar9;
      (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x188 + (long)p_Var25);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x190 + (long)p_Var25);
    }
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = *(undefined4 **)(&this->field_0x150 + (long)p_Var25);
    _elempack = uVar30 * iVar27;
    Mat::create(local_48,(int)(_h * _h_00 * uVar3) / _elempack,(ulong)(uint)(_elempack * 4),
                _elempack,(Allocator *)0x0);
    pMVar10 = local_48;
    if (0 < (int)uVar3) {
      pvVar5 = (local_c0->weight_data_tm).data;
      lVar26 = iVar2 * lVar28;
      lVar29 = _h * lVar26;
      local_40 = lVar29 * 4;
      local_38 = lVar28 * 4;
      local_160 = (Allocator *)0x0;
      do {
        if (0 < iVar2) {
          local_b0 = local_50;
          lVar23 = 0;
          do {
            if (0 < iVar1) {
              lVar19 = 0;
              puVar16 = local_b0;
              do {
                if (0 < _h) {
                  uVar15 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 |
                           (ulong)local_160 & 0xffffffff;
                  uVar20 = 0;
                  puVar21 = puVar16;
                  do {
                    uVar7 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar5 +
                     (long)(int)((((int)((long)uVar7 / (long)(int)uVar30) +
                                  ((int)lVar19 +
                                  ((int)((long)uVar15 / (long)iVar27) * iVar2 + (int)lVar23) * iVar1
                                  ) * (_h / (int)uVar30)) * uVar30 +
                                 (int)((long)uVar7 % (long)(int)uVar30)) * iVar27 +
                                (int)((long)uVar15 % (long)iVar27)) * 4) = *puVar21;
                    uVar20 = uVar20 + 1;
                    puVar21 = puVar21 + lVar26;
                  } while ((uVar22 & 0xffffffff) != uVar20);
                }
                lVar19 = lVar19 + 1;
                puVar16 = puVar16 + 1;
              } while (lVar19 != lVar28);
            }
            lVar23 = lVar23 + 1;
            local_b0 = local_b0 + lVar28;
          } while (lVar23 != iVar2);
        }
        local_160 = (Allocator *)((long)&local_160->_vptr_Allocator + 1);
        local_50 = local_50 + lVar29;
      } while (local_160 != local_b8);
    }
    Mat::reshape(&local_158,local_48,_h / (int)uVar30,_h_00,
                 (int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 |
                             (ulong)local_b8 & 0xffffffff) / (long)iVar27),(Allocator *)0x0);
    this = local_c0;
    opt = local_168;
    piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (&local_158 != pMVar10) {
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (local_c0->weight_data_tm).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar5 = (local_c0->weight_data_tm).data;
          pAVar17 = (local_c0->weight_data_tm).allocator;
          if (pAVar17 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar17->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      (this->weight_data_tm).data = local_158.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      (this->weight_data_tm).elemsize = local_158.elemsize;
      (this->weight_data_tm).elempack = local_158.elempack;
      (this->weight_data_tm).allocator = local_158.allocator;
      (this->weight_data_tm).dims = local_158.dims;
      (this->weight_data_tm).w = local_158.w;
      (this->weight_data_tm).h = local_158.h;
      (this->weight_data_tm).d = local_158.d;
      (this->weight_data_tm).c = local_158.c;
      (this->weight_data_tm).cstep = local_158.cstep;
    }
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var25 = this->_vptr_DeformableConv2D_x86_avx[-3];
    piVar14 = *(int **)(&this->field_0x158 + (long)p_Var25);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (*(long **)(&this->field_0x170 + (long)p_Var25) == (long *)0x0) {
          if (*(void **)(&this->field_0x150 + (long)p_Var25) != (void *)0x0) {
            free(*(void **)(&this->field_0x150 + (long)p_Var25));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x170 + (long)p_Var25) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x190 + (long)p_Var25) = 0;
    *(undefined8 *)(&this->field_0x15c + (long)p_Var25) = 0;
    *(undefined8 *)(&this->field_0x164 + (long)p_Var25) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var25) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var25) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var25) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var25) = 0;
    *(undefined4 *)(&this->field_0x188 + (long)p_Var25) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_avx::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}